

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

MethodDescriptor * __thiscall
google::protobuf::ServiceDescriptor::FindMethodByName(ServiceDescriptor *this,string *key)

{
  size_type __bkt;
  long lVar1;
  __node_ptr p_Var2;
  char cVar3;
  MethodDescriptor *pMVar4;
  char *pcVar5;
  
  pcVar5 = (key->_M_dataplus)._M_p;
  __bkt = (*(undefined8 **)(*(long *)(this + 0x10) + 0xa8))[1];
  cVar3 = *pcVar5;
  if (cVar3 == '\0') {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      pcVar5 = pcVar5 + 1;
      lVar1 = (long)cVar3 + lVar1 * 5;
      cVar3 = *pcVar5;
    } while (cVar3 != '\0');
  }
  pMVar4 = (MethodDescriptor *)0x0;
  p_Var2 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)**(undefined8 **)(*(long *)(this + 0x10) + 0xa8),__bkt,
                          (key_type *)((ulong)((long)this * 0xffff + lVar1) % __bkt),
                          (__hash_code)this);
  if (p_Var2 != (__node_ptr)0x0) {
    if (*(int *)((long)&(p_Var2->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x10) == 7) {
      pMVar4 = *(MethodDescriptor **)
                ((long)&(p_Var2->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x18);
    }
    else {
      pMVar4 = (MethodDescriptor *)0x0;
    }
  }
  return pMVar4;
}

Assistant:

const MethodDescriptor*
ServiceDescriptor::FindMethodByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::METHOD);
  if (!result.IsNull()) {
    return result.method_descriptor;
  } else {
    return NULL;
  }
}